

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free(nk_context *ctx)

{
  nk_size in_RDI;
  
  if (in_RDI != 0) {
    nk_buffer_free((nk_buffer *)0x129151);
    if (*(int *)(in_RDI + 0x4074) != 0) {
      nk_pool_free((nk_pool *)ctx);
    }
    nk_zero(ctx,in_RDI);
    nk_zero(ctx,in_RDI);
    nk_zero(ctx,in_RDI);
    *(undefined4 *)(in_RDI + 0x40ec) = 0;
    *(undefined4 *)(in_RDI + 0x4070) = 0;
    *(undefined8 *)(in_RDI + 0x40c0) = 0;
    *(undefined8 *)(in_RDI + 0x40c8) = 0;
    *(undefined8 *)(in_RDI + 0x40d0) = 0;
    *(undefined8 *)(in_RDI + 0x40d8) = 0;
    *(undefined8 *)(in_RDI + 0x40e0) = 0;
    *(undefined4 *)(in_RDI + 0x40e8) = 0;
  }
  return;
}

Assistant:

NK_API void
nk_free(struct nk_context *ctx)
{
NK_ASSERT(ctx);
if (!ctx) return;
nk_buffer_free(&ctx->memory);
if (ctx->use_pool)
nk_pool_free(&ctx->pool);

nk_zero(&ctx->input, sizeof(ctx->input));
nk_zero(&ctx->style, sizeof(ctx->style));
nk_zero(&ctx->memory, sizeof(ctx->memory));

ctx->seq = 0;
ctx->build = 0;
ctx->begin = 0;
ctx->end = 0;
ctx->active = 0;
ctx->current = 0;
ctx->freelist = 0;
ctx->count = 0;
}